

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Triple.cpp
# Opt level: O1

SubArchType parseSubArch(StringRef SubArchName)

{
  ArchKind AVar1;
  SubArchType SVar2;
  SubArchType SVar3;
  size_t in_RDX;
  ARM *this;
  bool bVar4;
  bool bVar5;
  StringRef Arch;
  StringRef Arch_00;
  
  Arch.Data = (char *)SubArchName.Length;
  this = (ARM *)SubArchName.Data;
  Arch.Length = in_RDX;
  Arch_00 = llvm::ARM::getCanonicalArchName(this,Arch);
  if (Arch_00.Length == 0) {
    if (Arch.Data < (char *)0x8) {
      bVar4 = false;
    }
    else {
      bVar4 = *(long *)(this + -8 + (long)Arch.Data) == 0x3361626d696c616b;
    }
    SVar3 = KalimbaSubArch_v3;
    if (!bVar4) {
      if (Arch.Data < (char *)0x8) {
        bVar5 = false;
      }
      else {
        bVar5 = *(long *)(this + -8 + (long)Arch.Data) == 0x3461626d696c616b;
      }
      SVar3 = bVar5 + KalimbaSubArch_v3;
      bVar4 = true;
      if (bVar5 == false) {
        bVar4 = false;
      }
    }
    if (!bVar4) {
      if (Arch.Data < (char *)0x8) {
        bVar5 = false;
      }
      else {
        bVar5 = *(long *)(this + -8 + (long)Arch.Data) == 0x3561626d696c616b;
      }
      if (bVar5) {
        SVar3 = KalimbaSubArch_v5;
      }
      bVar4 = true;
      if (!bVar5) {
        bVar4 = false;
      }
    }
    SVar2 = NoSubArch;
    if (bVar4) {
      SVar2 = SVar3;
    }
  }
  else {
    AVar1 = llvm::ARM::parseArch(Arch_00);
    SVar2 = NoSubArch;
    if (AVar1 - ARMV4T < 0x1b) {
      SVar2 = *(SubArchType *)(&DAT_00169194 + (ulong)(AVar1 - ARMV4T) * 4);
    }
  }
  return SVar2;
}

Assistant:

static Triple::SubArchType parseSubArch(StringRef SubArchName) {
  StringRef ARMSubArch = ARM::getCanonicalArchName(SubArchName);

  // For now, this is the small part. Early return.
  if (ARMSubArch.empty())
    return StringSwitch<Triple::SubArchType>(SubArchName)
      .EndsWith("kalimba3", Triple::KalimbaSubArch_v3)
      .EndsWith("kalimba4", Triple::KalimbaSubArch_v4)
      .EndsWith("kalimba5", Triple::KalimbaSubArch_v5)
      .Default(Triple::NoSubArch);

  // ARM sub arch.
  switch(ARM::parseArch(ARMSubArch)) {
  case ARM::ArchKind::ARMV4:
    return Triple::NoSubArch;
  case ARM::ArchKind::ARMV4T:
    return Triple::ARMSubArch_v4t;
  case ARM::ArchKind::ARMV5T:
    return Triple::ARMSubArch_v5;
  case ARM::ArchKind::ARMV5TE:
  case ARM::ArchKind::IWMMXT:
  case ARM::ArchKind::IWMMXT2:
  case ARM::ArchKind::XSCALE:
  case ARM::ArchKind::ARMV5TEJ:
    return Triple::ARMSubArch_v5te;
  case ARM::ArchKind::ARMV6:
    return Triple::ARMSubArch_v6;
  case ARM::ArchKind::ARMV6K:
  case ARM::ArchKind::ARMV6KZ:
    return Triple::ARMSubArch_v6k;
  case ARM::ArchKind::ARMV6T2:
    return Triple::ARMSubArch_v6t2;
  case ARM::ArchKind::ARMV6M:
    return Triple::ARMSubArch_v6m;
  case ARM::ArchKind::ARMV7A:
  case ARM::ArchKind::ARMV7R:
    return Triple::ARMSubArch_v7;
  case ARM::ArchKind::ARMV7VE:
    return Triple::ARMSubArch_v7ve;
  case ARM::ArchKind::ARMV7K:
    return Triple::ARMSubArch_v7k;
  case ARM::ArchKind::ARMV7M:
    return Triple::ARMSubArch_v7m;
  case ARM::ArchKind::ARMV7S:
    return Triple::ARMSubArch_v7s;
  case ARM::ArchKind::ARMV7EM:
    return Triple::ARMSubArch_v7em;
  case ARM::ArchKind::ARMV8A:
    return Triple::ARMSubArch_v8;
  case ARM::ArchKind::ARMV8_1A:
    return Triple::ARMSubArch_v8_1a;
  case ARM::ArchKind::ARMV8_2A:
    return Triple::ARMSubArch_v8_2a;
  case ARM::ArchKind::ARMV8_3A:
    return Triple::ARMSubArch_v8_3a;
  case ARM::ArchKind::ARMV8_4A:
    return Triple::ARMSubArch_v8_4a;
  case ARM::ArchKind::ARMV8R:
    return Triple::ARMSubArch_v8r;
  case ARM::ArchKind::ARMV8MBaseline:
    return Triple::ARMSubArch_v8m_baseline;
  case ARM::ArchKind::ARMV8MMainline:
    return Triple::ARMSubArch_v8m_mainline;
  default:
    return Triple::NoSubArch;
  }
}